

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

boolean boulder_hits_pool(obj *otmp,int rx,int ry,boolean pushing)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  boolean bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  trap *ttmp;
  char *pcVar10;
  char *pcVar11;
  int tmp;
  int n;
  bool bVar12;
  
  if ((otmp == (obj *)0x0) || (otmp->otyp != 0x214)) {
    warning("Not a boulder?");
    return '\0';
  }
  bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if ((bVar4 != '\0') ||
     (((bVar4 = is_pool(level,rx,ry), bVar4 == '\0' && (bVar4 = is_lava(level,rx,ry), bVar4 == '\0')
       ) && (bVar4 = is_swamp(level,rx,ry), bVar4 == '\0')))) {
    return '\0';
  }
  bVar4 = is_lava(level,rx,ry);
  bVar5 = is_swamp(level,rx,ry);
  pcVar9 = waterbody_name((xchar)rx,(xchar)ry);
  cVar6 = level->locations[rx][ry].typ;
  uVar7 = mt_random();
  if ((bVar5 == '\0') &&
     ((bVar4 == '\0') ==
      (uVar7 * -0x33333333 >> 1 | (uint)((uVar7 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)) {
    bVar12 = pushing == '\0';
    if ((u._1052_1_ & 2) == 0) {
      if (pushing == '\0') {
        bVar2 = false;
LAB_0016d677:
        bVar12 = true;
        bVar3 = bVar2;
        if ((viz_array[ry][rx] & 2U) == 0) goto LAB_0016d6a2;
LAB_0016d875:
        pcVar10 = xname(otmp);
        pcVar10 = the(pcVar10);
        pcVar11 = "falls into";
        if (bVar2) {
          pcVar11 = "fills";
        }
        pline("There is a large splash as %s %s the %s.",pcVar10,pcVar11,pcVar9);
        wake_nearto(rx,ry,0x28);
      }
      else {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
            if (((youmonst.data)->mflags1 & 0x1000) == 0) {
              bVar2 = false;
              bVar12 = false;
              goto LAB_0016d875;
            }
            goto LAB_0016d79a;
          }
        }
        else {
LAB_0016d79a:
          if (ublindf == (obj *)0x0) {
            bVar12 = false;
            bVar3 = false;
            goto LAB_0016d6a2;
          }
        }
        bVar2 = false;
        bVar12 = false;
        bVar3 = false;
        if (ublindf->oartifact == '\x1d') goto LAB_0016d875;
LAB_0016d6a2:
        bVar2 = bVar3;
        if (flags.soundok == '\0') {
          wake_nearto(rx,ry,0x28);
          if (bVar2) goto LAB_0016d8ce;
          bVar3 = false;
          goto LAB_0016d8f6;
        }
        pcVar9 = " sizzling";
        if (bVar4 == '\0') {
          pcVar9 = "";
        }
        You_hear("a%s splash.",pcVar9);
        wake_nearto(rx,ry,0x28);
      }
      bVar3 = false;
      if (bVar2) goto LAB_0016d8ce;
    }
    else {
      bVar3 = false;
    }
LAB_0016d8f6:
    if ((bVar4 == '\0') || (iVar8 = dist2(rx,ry,(int)u.ux,(int)u.uy), 2 < iVar8)) {
      if (bVar3 || flags.verbose == '\0') goto joined_r0x0016da90;
      if (!bVar12) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016d9cd;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016d9c4;
        }
        else {
LAB_0016d9c4:
          if (ublindf == (obj *)0x0) goto LAB_0016da5c;
LAB_0016d9cd:
          if (ublindf->oartifact != '\x1d') goto LAB_0016da5c;
        }
        pcVar9 = "It sinks without a trace!";
LAB_0016d7f0:
        pline(pcVar9);
        goto LAB_0016da5c;
      }
      if ((viz_array[ry][rx] & 2U) != 0) {
        pline("It sinks without a trace!");
      }
    }
    else {
      pline("You are hit by molten lava%c");
      n = 3;
      iVar8 = -3;
      do {
        uVar7 = mt_random();
        n = n + uVar7 % 6;
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0);
      fire_damageu(n,(monst *)0x0,"molten lava",1,0,'\0','\x01');
joined_r0x0016da90:
      if (!bVar12) goto LAB_0016da5c;
    }
    obfree(otmp,(obj *)0x0);
  }
  else {
    ttmp = t_at(level,rx,ry);
    if (cVar6 == '\x14') {
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe3f;
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 | 0xc0;
    }
    else {
      level->locations[rx][ry].typ = '\x19';
    }
    if (ttmp != (trap *)0x0) {
      delfloortrap(ttmp);
    }
    bury_objs(rx,ry);
    newsym(rx,ry);
    if (pushing == '\0') {
      bVar2 = true;
      bVar12 = true;
      if ((u._1052_1_ & 2) == 0) goto LAB_0016d677;
LAB_0016d8ce:
      bVar3 = true;
      if (((u._1052_1_ & 2) == 0) || (iVar8 = dist2(rx,ry,(int)u.ux,(int)u.uy), iVar8 != 0))
      goto LAB_0016d8f6;
      u._1052_1_ = u._1052_1_ & 0xfd;
      doredraw();
      vision_full_recalc = '\x01';
      pline("You find yourself on dry land again!");
      goto joined_r0x0016da90;
    }
    if (u.usteed == (monst *)0x0) {
      pcVar10 = xname(otmp);
      pcVar10 = the(pcVar10);
      pline("You push %s into the %s.",pcVar10,pcVar9);
    }
    else {
      pcVar10 = y_monnam(u.usteed);
      cVar6 = highc(*pcVar10);
      *pcVar10 = cVar6;
      pcVar11 = xname(otmp);
      pcVar11 = the(pcVar11);
      pline("%s pushes %s into the %s.",pcVar10,pcVar11,pcVar9);
    }
    if (flags.verbose != '\0') {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016d74a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016d741;
LAB_0016d7e9:
        pcVar9 = "Now you can cross it!";
        goto LAB_0016d7f0;
      }
LAB_0016d741:
      if (ublindf != (obj *)0x0) {
LAB_0016d74a:
        if (ublindf->oartifact == '\x1d') goto LAB_0016d7e9;
      }
    }
LAB_0016da5c:
    delobj(otmp);
  }
  return '\x01';
}

Assistant:

boolean boulder_hits_pool(struct obj *otmp, int rx, int ry, boolean pushing)
{
	if (!otmp || otmp->otyp != BOULDER)
	    warning("Not a boulder?");
	else if (!Is_waterlevel(&u.uz) &&
		 (is_pool(level, rx,ry) || is_lava(level, rx,ry) ||
		  is_swamp(level, rx,ry))) {
	    boolean lava = is_lava(level, rx,ry), fills_up;
	    boolean swamp = is_swamp(level, rx,ry);
	    const char *what = waterbody_name(rx,ry);
	    schar ltyp = level->locations[rx][ry].typ;
	    int chance = rn2(10);		/* water: 90%; lava: 10% */
	    fills_up = swamp ? TRUE : lava ? chance == 0 : chance != 0;

	    if (fills_up) {
		struct trap *ttmp = t_at(level, rx, ry);

		if (ltyp == DRAWBRIDGE_UP) {
		    level->locations[rx][ry].drawbridgemask &= ~DB_UNDER; /* clear lava */
		    level->locations[rx][ry].drawbridgemask |= DB_FLOOR;
		} else
		    level->locations[rx][ry].typ = ROOM;

		if (ttmp) delfloortrap(ttmp);
		bury_objs(rx, ry);
		
		newsym(rx,ry);
		if (pushing) {
		    if (u.usteed) {
			char *bp = y_monnam(u.usteed);
			*bp = highc(*bp); /* bp points to a static buffer */
			pline("%s pushes %s into the %s.",
			    bp, the(xname(otmp)), what);
		    } else
			pline("You push %s into the %s.", the(xname(otmp)), what);
		    if (flags.verbose && !Blind)
			pline("Now you can cross it!");
		    /* no splashing in this case */
		}
	    }
	    if (!fills_up || !pushing) {	/* splashing occurs */
		if (!u.uinwater) {
		    if (pushing ? !Blind : cansee(rx,ry)) {
			pline("There is a large splash as %s %s the %s.",
			      the(xname(otmp)), fills_up? "fills":"falls into",
			      what);
		    } else if (flags.soundok)
			You_hear("a%s splash.", lava ? " sizzling" : "");
		    wake_nearto(rx, ry, 40);
		}

		if (fills_up && u.uinwater && distu(rx,ry) == 0) {
		    u.uinwater = 0;
		    doredraw();
		    vision_full_recalc = 1;
		    pline("You find yourself on dry land again!");
		} else if (lava && distu(rx,ry) <= 2) {
		    pline("You are hit by molten lava%c",
			  FFire_resistance ? '.' : '!');
		    fire_damageu(dice(3, 6), NULL, "molten lava", KILLED_BY,
				 0, FALSE, TRUE);
		} else if (!fills_up && flags.verbose &&
			   (pushing ? !Blind : cansee(rx,ry)))
		    pline("It sinks without a trace!");
	    }

	    /* boulder is now gone */
	    if (pushing) delobj(otmp);
	    else obfree(otmp, NULL);
	    return TRUE;
	}
	return FALSE;
}